

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::growAtomicCounterBlock
          (TParseContext *this,int binding,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *typeList)

{
  TMap<int,_glslang::TVariable_*,_std::less<int>_> *this_00;
  TIntermediate *this_01;
  int iVar1;
  TBlockStorageClass newBacking;
  mapped_type *ppTVar2;
  undefined4 extraout_var;
  TQualifier *this_02;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int local_5c;
  TSourceLoc *local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  TType *local_40;
  TTypeList *local_38;
  
  this_00 = &(this->super_TParseContextBase).atomicCounterBuffers;
  local_5c = binding;
  local_38 = typeList;
  local_48 = (_Base_ptr)
             std::
             _Rb_tree<int,_std::pair<const_int,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_int,_glslang::TVariable_*>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
             ::find((_Rb_tree<int,_std::pair<const_int,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_int,_glslang::TVariable_*>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                     *)this_00,&local_5c);
  local_50 = &(this->super_TParseContextBase).atomicCounterBuffers.
              super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_48 == local_50) {
    (this->super_TParseContextBase).atomicCounterBlockSet =
         ((this->super_TParseContextBase).super_TParseVersions.intermediate)->atomicCounterBlockSet;
  }
  local_58 = loc;
  local_40 = memberType;
  TParseContextBase::growAtomicCounterBlock
            (&this->super_TParseContextBase,local_5c,loc,memberType,memberName,local_38);
  ppTVar2 = std::
            map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                         ,&local_5c);
  iVar1 = (*((*ppTVar2)->super_TSymbol)._vptr_TSymbol[0xd])();
  this_02 = (TQualifier *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar1));
  this_02->field_0xc = this_02->field_0xc | 8;
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) {
    this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x48])(this)
    ;
    newBacking = TIntermediate::getBlockStorageOverride
                           (this_01,(char *)CONCAT44(extraout_var_00,iVar1));
    if (newBacking != EbsNone) {
      if (local_48 == local_50) {
        TQualifier::setBlockStorage(this_02,newBacking);
        blockQualifierCheck(this,local_58,this_02,false);
      }
      iVar1 = (*local_40->_vptr_TType[10])();
      TQualifier::setBlockStorage((TQualifier *)CONCAT44(extraout_var_01,iVar1),newBacking);
    }
  }
  return;
}

Assistant:

void TParseContext::growAtomicCounterBlock(int binding, const TSourceLoc& loc, TType& memberType, const TString& memberName, TTypeList* typeList)
{
    bool createBlock = atomicCounterBuffers.find(binding) == atomicCounterBuffers.end();

    if (createBlock) {
        atomicCounterBlockSet = intermediate.getAtomicCounterBlockSet();
    }

    // use base class function to create/expand block
    TParseContextBase::growAtomicCounterBlock(binding, loc, memberType, memberName, typeList);
    TQualifier& qualifier = atomicCounterBuffers[binding]->getWritableType().getQualifier();
    qualifier.defaultBlock = true;

    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        // check for a Block storage override
        TBlockStorageClass storageOverride = intermediate.getBlockStorageOverride(getAtomicCounterBlockName());

        if (storageOverride != EbsNone) {
            if (createBlock) {
                // Remap block storage

                qualifier.setBlockStorage(storageOverride);

                // check that the change didn't create errors
                blockQualifierCheck(loc, qualifier, false);
            }

            // remap meber storage as well
            memberType.getQualifier().setBlockStorage(storageOverride);
        }
    }
}